

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

double ON_ArrayMagnitude(int dim,double *A)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  switch(dim) {
  case 0:
    dVar2 = 0.0;
    break;
  case 1:
    return ABS(*A);
  case 2:
    dVar2 = ABS(*A);
    dVar4 = ABS(A[1]);
    if (dVar2 <= dVar4) {
      if (dVar2 < dVar4) {
        dVar2 = (dVar2 / dVar4) * (dVar2 / dVar4);
        goto LAB_004e871e;
      }
      dVar4 = 1.4142135623730951;
    }
    else {
      dVar4 = SQRT((dVar4 / dVar2) * (dVar4 / dVar2) + 1.0);
    }
LAB_004e87a1:
    return dVar4 * dVar2;
  case 3:
    dVar2 = ABS(*A);
    dVar3 = ABS(A[1]);
    dVar4 = ABS(A[2]);
    if (dVar3 <= dVar2) {
      if (dVar4 <= dVar2) {
        if (((dVar2 != dVar3) || (dVar2 != dVar4)) || (NAN(dVar2) || NAN(dVar4))) {
          dVar4 = SQRT((dVar3 / dVar2) * (dVar3 / dVar2) + (dVar4 / dVar2) * (dVar4 / dVar2) + 1.0);
        }
        else {
          dVar4 = 1.7320508075688772;
        }
        goto LAB_004e87a1;
      }
    }
    else if (dVar4 <= dVar3) {
      return SQRT((dVar2 / dVar3) * (dVar2 / dVar3) + (dVar4 / dVar3) * (dVar4 / dVar3) + 1.0) *
             dVar3;
    }
    dVar2 = (dVar2 / dVar4) * (dVar2 / dVar4) + (dVar3 / dVar4) * (dVar3 / dVar4);
LAB_004e871e:
    return SQRT(dVar2 + 1.0) * dVar4;
  default:
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + A[lVar1] * A[lVar1];
      lVar1 = lVar1 + 1;
    } while (dim != (int)lVar1);
  }
  if (0.0 <= dVar2) {
    return SQRT(dVar2);
  }
  dVar2 = sqrt(dVar2);
  return dVar2;
}

Assistant:

double ON_ArrayMagnitude(int dim, const double* A)
{
  double a, b, c, len;
  switch(dim) {
  case 1:
    len = fabs(*A); 
    break;
  case 2:
    a = fabs(*A++); b = fabs(*A);
    if (a > b) 
      {b /= a; len = a*sqrt(1.0+b*b);}
    else if (b > a) 
      {a /= b; len = b*sqrt(1.0+a*a);}
    else
      len = a*ON_SQRT2;
    break;
  case 3:
    a = fabs(*A++); b = fabs(*A++); c = fabs(*A);
    if (a >= b) {
      if (a >= c) {
        if (a == b && a == c) 
          len = a*ON_SQRT3;
        else
          {b /= a; c /= a; len = a*sqrt(1.0 + (b*b + c*c));}
      }
      else 
        {a /= c; b /= c; len = c*sqrt(1.0 + (a*a + b*b));}
    }
    else if (b >= c) 
      {a /= b; c /= b; len = b*sqrt(1.0 + (a*a + c*c));}
    else 
      {b /= c; a /= c; len = c*sqrt(1.0 + (a*a + b*b));}
    break;
  default:
    len = 0.0;
    while (dim--) {a = *A++; len += a*a;}
    len = sqrt(len);
    break;
  }
  return len;
}